

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_from_storage(secp256k1_fe *r,secp256k1_fe_storage *a)

{
  r->n[0] = a->n[0] & 0xfffffffffffff;
  r->n[1] = (a->n[1] & 0xffffffffff) << 0xc | a->n[0] >> 0x34;
  r->n[2] = (a->n[2] & 0xfffffff) << 0x18 | a->n[1] >> 0x28;
  r->n[3] = (a->n[3] & 0xffff) << 0x24 | a->n[2] >> 0x1c;
  r->n[4] = a->n[3] >> 0x10;
  r->magnitude = 1;
  r->normalized = 1;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_from_storage(secp256k1_fe *r, const secp256k1_fe_storage *a) {
    secp256k1_fe_impl_from_storage(r, a);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}